

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer *
Serialize<PClassActor>(FSerializer *arc,char *key,PClassActor **clst,PClassActor **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  Value *this;
  Ch *cc;
  char *name;
  PClassActor *pPVar4;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if ((uVar1 >> 10 & 1) == 0) {
        if (uVar1 != 0) {
          __assert_fail("val->IsString() || val->IsNull()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x723,
                        "FSerializer &Serialize(FSerializer &, const char *, PClassActor *&, PClassActor **)"
                       );
        }
        *clst = (PClassActor *)0x0;
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        name = UnicodeToString(cc);
        pPVar4 = PClass::FindActor(name);
        *clst = pPVar4;
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 == 0) || (def == (PClassActor **)0x0)) ||
        ((pFVar3->mInObject).Array[uVar2 - 1] == false)) || (*clst != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*clst == (PClassActor *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,FName::NameData.NameArray
                               [((*clst)->super_PClass).super_PNativeStruct.super_PStruct.
                                super_PNamedType.TypeName.Index].Text);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, PClassActor *&clst, PClassActor **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || clst != *def)
		{
			arc.WriteKey(key);
			if (clst == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(clst->TypeName.GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsString() || val->IsNull());
			if (val->IsString())
			{
				clst = PClass::FindActor(UnicodeToString(val->GetString()));
			}
			else if (val->IsNull())
			{
				clst = nullptr;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				clst = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}